

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

float spirv_cross::SPIRConstant::f16_to_f32(uint16_t u16_value)

{
  int iVar1;
  uint local_1c;
  anon_union_4_2_43a84cd0 u;
  int m;
  int e;
  int s;
  uint16_t u16_value_local;
  
  iVar1 = (int)(uint)u16_value >> 0xf;
  u.u32 = (int)(uint)u16_value >> 10 & 0x1f;
  local_1c = u16_value & 0x3ff;
  if (u.u32 == 0) {
    if ((u16_value & 0x3ff) == 0) {
      return (float)(iVar1 << 0x1f);
    }
    u.f32 = 0.0;
    for (; (local_1c & 0x400) == 0; local_1c = local_1c << 1) {
      u.u32 = u.u32 - 1;
    }
    u.u32 = u.u32 + 1;
    local_1c = local_1c & 0xfffffbff;
  }
  else if (u.u32 == 0x1f) {
    if ((u16_value & 0x3ff) == 0) {
      return (float)(iVar1 << 0x1f | 0x7f800000);
    }
    return (float)(iVar1 << 0x1f | 0x7f800000U | local_1c << 0xd);
  }
  return (float)(iVar1 << 0x1f | (u.u32 + 0x70) * 0x800000 | local_1c << 0xd);
}

Assistant:

static inline float f16_to_f32(uint16_t u16_value)
	{
		// Based on the GLM implementation.
		int s = (u16_value >> 15) & 0x1;
		int e = (u16_value >> 10) & 0x1f;
		int m = (u16_value >> 0) & 0x3ff;

		union
		{
			float f32;
			uint32_t u32;
		} u;

		if (e == 0)
		{
			if (m == 0)
			{
				u.u32 = uint32_t(s) << 31;
				return u.f32;
			}
			else
			{
				while ((m & 0x400) == 0)
				{
					m <<= 1;
					e--;
				}

				e++;
				m &= ~0x400;
			}
		}
		else if (e == 31)
		{
			if (m == 0)
			{
				u.u32 = (uint32_t(s) << 31) | 0x7f800000u;
				return u.f32;
			}
			else
			{
				u.u32 = (uint32_t(s) << 31) | 0x7f800000u | (m << 13);
				return u.f32;
			}
		}

		e += 127 - 15;
		m <<= 13;
		u.u32 = (uint32_t(s) << 31) | (e << 23) | m;
		return u.f32;
	}